

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathPositionFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr value;
  int iVar1;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 0) {
    if (ctxt->valueNr < ctxt->valueFrame) {
      iVar1 = 0x17;
    }
    else {
      iVar1 = ctxt->context->proximityPosition;
      if (-1 < iVar1) {
        value = xmlXPathCacheNewFloat(ctxt->context,(double)iVar1);
        valuePush(ctxt,value);
        return;
      }
      iVar1 = 0xe;
    }
  }
  else {
    iVar1 = 0xc;
  }
  xmlXPathErr(ctxt,iVar1);
  return;
}

Assistant:

void
xmlXPathPositionFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    CHECK_ARITY(0);
    if (ctxt->context->proximityPosition >= 0) {
	valuePush(ctxt,
	      xmlXPathCacheNewFloat(ctxt->context,
		(double) ctxt->context->proximityPosition));
#ifdef DEBUG_EXPR
	xmlGenericError(xmlGenericErrorContext, "position() : %d\n",
		ctxt->context->proximityPosition);
#endif
    } else {
	XP_ERROR(XPATH_INVALID_CTXT_POSITION);
    }
}